

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.h
# Opt level: O2

void __thiscall sundials::Context::Context(Context *this,void *comm)

{
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_> local_20;
  
  (this->sunctx_)._M_t.super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
  _M_t.super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>.
  super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl = (_SUNContext **)0x0;
  __p_00 = (pointer)operator_new(8);
  *__p_00 = (_SUNContext *)0x0;
  local_20._M_t.super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>.
  super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl =
       (tuple<_SUNContext_**,_std::default_delete<_SUNContext_*>_>)
       (_Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>)0x0;
  std::__uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>::reset
            ((__uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_> *)this,__p_00);
  std::unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_>::~unique_ptr
            ((unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_> *)&local_20);
  SUNContext_Create(comm,(this->sunctx_)._M_t.
                         super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
                         _M_t.
                         super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                         .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  return;
}

Assistant:

explicit Context(void* comm = NULL)
  {
    sunctx_ = std::unique_ptr<SUNContext>(new SUNContext());
    SUNContext_Create(comm, sunctx_.get());
  }